

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

double __thiscall GoState<3U,_4U>::get_result(GoState<3U,_4U> *this,int current_player_to_move)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long *in_RDI;
  int winner;
  int score2;
  int score1;
  undefined4 local_20;
  undefined8 local_8;
  
  iVar1 = (**(code **)(*in_RDI + 0x68))(in_RDI,1);
  iVar2 = (**(code **)(*in_RDI + 0x68))(in_RDI,2);
  if (iVar1 == iVar2) {
    local_8 = 0.5;
  }
  else {
    if (iVar2 < iVar1) {
      local_20 = 1;
    }
    else {
      local_20 = 2;
    }
    if (local_20 == in_ESI) {
      local_8 = 0.0;
    }
    else {
      local_8 = 1.0;
    }
  }
  return local_8;
}

Assistant:

virtual double get_result(int current_player_to_move) const
	{
		int score1 = get_player_score(1);
		int score2 = get_player_score(2);

		if (score1 == score2) {
			return 0.5;
		}
		int winner = 0;
		if (score1 > score2) {
			winner = 1;
		}
		else {
			winner = 2;
		}

		if (winner == current_player_to_move) {
			return 0.0;
		}
		else {
			return 1.0;
		}
	}